

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

void __thiscall gimage::PNMImageIO::save(PNMImageIO *this,ImageFloat *image,char *name)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  char *in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  long *in_RDI;
  work_t wVar7;
  failure *ex;
  int j;
  long i;
  long k;
  streambuf *sb;
  ofstream out;
  string type;
  bool msbfirst;
  char *c;
  float s;
  float p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  undefined6 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5e;
  undefined1 in_stack_fffffffffffffc5f;
  byte bVar8;
  IOException *in_stack_fffffffffffffc60;
  int local_2ec;
  long local_2e8;
  long local_2e0;
  long local_2d0 [47];
  float in_stack_fffffffffffffeac;
  long in_stack_fffffffffffffeb0;
  long in_stack_fffffffffffffeb8;
  long in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  allocator local_c9;
  string local_c8 [35];
  undefined1 local_a5;
  allocator local_91;
  string local_90 [103];
  byte local_29;
  store_t_conflict *local_28;
  float local_20;
  store_t_conflict local_1c;
  char *local_18;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  
  local_28 = &local_1c;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_29 = gutil::isMSBFirst();
  uVar4 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,0);
  if (((uVar4 & 1) != 0) &&
     ((iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10), iVar2 == 1 ||
      (iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10), iVar2 == 3)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Pf",&local_c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10);
    if (iVar2 == 3) {
      std::__cxx11::string::operator=(local_c8,"PF");
    }
    wVar7 = Image<float,_gimage::PixelTraits<float>_>::maxValue
                      ((Image<float,_gimage::PixelTraits<float>_> *)
                       CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    if (wVar7 <= 0.0) {
      local_20 = 1.0;
    }
    else {
      local_20 = 1.0 / wVar7;
    }
    std::__cxx11::string::c_str();
    Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
    Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
    anon_unknown_11::writePNMHeader
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    std::ofstream::ofstream(local_2d0);
    uVar5 = *(undefined8 *)(local_2d0[0] + -0x18);
    std::operator|(_S_failbit,_S_badbit);
    std::ios::exceptions((int)local_2d0 + (int)uVar5);
    std::operator|(_S_bin,_S_app);
    std::ofstream::open((char *)local_2d0,(_Ios_Openmode)local_18);
    cVar1 = std::ofstream::rdbuf();
    local_2e0 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
    while( true ) {
      local_2e0 = local_2e0 + -1;
      bVar8 = 0;
      if (-1 < local_2e0) {
        bVar8 = std::ios::good();
      }
      if ((bVar8 & 1) == 0) break;
      for (local_2e8 = 0; lVar6 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10),
          local_2e8 < lVar6; local_2e8 = local_2e8 + 1) {
        local_2ec = 0;
        while (iVar2 = local_2ec,
              iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10), iVar2 < iVar3)
        {
          local_1c = Image<float,_gimage::PixelTraits<float>_>::get
                               (local_10,local_2e8,local_2e0,local_2ec);
          if ((local_29 & 1) == 0) {
            std::streambuf::sputc(cVar1);
            std::streambuf::sputc(cVar1);
            std::streambuf::sputc(cVar1);
            std::streambuf::sputc(cVar1);
          }
          else {
            std::streambuf::sputc(cVar1);
            std::streambuf::sputc(cVar1);
            std::streambuf::sputc(cVar1);
            std::streambuf::sputc(cVar1);
          }
          local_2ec = local_2ec + 1;
        }
      }
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_2d0);
    std::__cxx11::string::~string(local_c8);
    return;
  }
  local_a5 = 1;
  uVar5 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,local_18,&local_91);
  std::operator+((char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  std::operator+(in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20);
  gutil::IOException::IOException
            (in_stack_fffffffffffffc60,
             (string *)
             CONCAT17(in_stack_fffffffffffffc5f,
                      CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
  local_a5 = 0;
  __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void PNMImageIO::save(const ImageFloat &image, const char *name) const
{
  float p, s;
  char *c=reinterpret_cast<char *>(&p);
  bool msbfirst=gutil::isMSBFirst();

  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNM images with depth 1 or 3 ("+std::string(name)+")");
  }

  std::string type="Pf";

  if (image.getDepth() == 3)
  {
    type="PF";
  }

  s=image.maxValue();

  if (s > 0)
  {
    s=1/s;
  }
  else
  {
    s=1;
  }

  writePNMHeader(name, type.c_str(), image.getWidth(), image.getHeight(),
                 0, s);

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary|std::ios::app);

    std::streambuf *sb=out.rdbuf();

    for (long k=image.getHeight()-1; k>=0 && out.good(); k--)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int j=0; j<image.getDepth(); j++)
        {
          // we assume that the plattform uses IEEE 32 bit floating
          // point format, otherwise this will not work

          p=static_cast<float>(image.get(i, k, j));

          if (msbfirst)
          {
            sb->sputc(c[0]);
            sb->sputc(c[1]);
            sb->sputc(c[2]);
            sb->sputc(c[3]);
          }
          else
          {
            sb->sputc(c[3]);
            sb->sputc(c[2]);
            sb->sputc(c[1]);
            sb->sputc(c[0]);
          }
        }
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}